

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
::swap(btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
       *this,btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
             *x,allocator_type *alloc)

{
  btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
  bVar1;
  undefined4 uVar2;
  btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
  *x_00;
  btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
  **ppbVar3;
  btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
  **ppbVar4;
  btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
  **ppbVar5;
  btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
  *pbVar6;
  long lVar7;
  size_type i;
  char *__function;
  ulong i_00;
  allocator_type *in_R9;
  btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
  *this_00;
  ulong uVar8;
  bool bVar9;
  
  if ((((ulong)this & 7) == 0) && (((ulong)x & 7) == 0)) {
    if ((this[0xb] !=
        (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
         )0x0) != (x[0xb] !=
                  (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
                   )0x0)) {
      __assert_fail("leaf() == x->leaf()",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0x942,
                    "void phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>>::swap(btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>]"
                   );
    }
    this_00 = x;
    x_00 = this;
    if ((byte)x[10] < (byte)this[10]) {
      this_00 = this;
      x_00 = x;
    }
    bVar1 = x_00[10];
    if (bVar1 == (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
                  )0x0) {
      i = 0;
    }
    else {
      lVar7 = 0xc;
      do {
        pbVar6 = x_00 + lVar7;
        uVar2 = *(undefined4 *)pbVar6;
        *(undefined4 *)pbVar6 = *(undefined4 *)(this_00 + lVar7);
        *(undefined4 *)(this_00 + lVar7) = uVar2;
        uVar2 = *(undefined4 *)(pbVar6 + 4);
        *(undefined4 *)(pbVar6 + 4) = *(undefined4 *)(this_00 + lVar7 + 4);
        *(undefined4 *)(this_00 + lVar7 + 4) = uVar2;
        uVar2 = *(undefined4 *)(pbVar6 + 8);
        *(undefined4 *)(pbVar6 + 8) = *(undefined4 *)(this_00 + lVar7 + 8);
        *(undefined4 *)(this_00 + lVar7 + 8) = uVar2;
        uVar2 = *(undefined4 *)(pbVar6 + 0xc);
        *(undefined4 *)(pbVar6 + 0xc) = *(undefined4 *)(this_00 + lVar7 + 0xc);
        *(undefined4 *)(this_00 + lVar7 + 0xc) = uVar2;
        lVar7 = lVar7 + 0x10;
      } while (pbVar6 + 0x10 != x_00 + (ulong)(byte)bVar1 * 0x10 + 0xc);
      i = (size_type)(byte)x_00[10];
    }
    uninitialized_move_n(this_00,(byte)this_00[10] - i,i,i,x_00,in_R9);
    if (this[0xb] ==
        (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
         )0x0) {
      ppbVar3 = mutable_child(x_00,0);
      ppbVar4 = mutable_child(x_00,(ulong)(byte)x_00[10] + 1);
      ppbVar5 = mutable_child(this_00,0);
      for (; ppbVar3 != ppbVar4; ppbVar3 = ppbVar3 + 1) {
        pbVar6 = *ppbVar3;
        *ppbVar3 = *ppbVar5;
        *ppbVar5 = pbVar6;
        ppbVar5 = ppbVar5 + 1;
      }
      uVar8 = 0;
      do {
        i_00 = uVar8;
        pbVar6 = child(x_00,i_00);
        if (((ulong)pbVar6 & 7) != 0) {
LAB_0014c002:
          __function = 
          "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::pair<int, int>, std::pair<int, int>>, phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::pair<int, int>, std::pair<int, int>>, phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = char]"
          ;
          goto LAB_0014c017;
        }
        *(btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
          **)pbVar6 = x_00;
        pbVar6 = child(this_00,i_00);
        if (((ulong)pbVar6 & 7) != 0) goto LAB_0014c002;
        *(btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
          **)pbVar6 = this_00;
        uVar8 = i_00 + 1;
      } while (i_00 < (byte)x_00[10]);
      if (i_00 < (byte)this_00[10]) {
        do {
          pbVar6 = child(this_00,uVar8);
          init_child(x_00,(int)uVar8,pbVar6);
          mutable_child(this_00,uVar8);
          bVar9 = uVar8 < (byte)this_00[10];
          uVar8 = uVar8 + 1;
        } while (bVar9);
      }
    }
    bVar1 = this[10];
    this[10] = x[10];
    x[10] = bVar1;
    return;
  }
  __function = 
  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::pair<int, int>, std::pair<int, int>>, phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::pair<int, int>, std::pair<int, int>>, phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
  ;
LAB_0014c017:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,__function);
}

Assistant:

void btree_node<P>::swap(btree_node *x, allocator_type *alloc) {
        using std::swap;
        assert(leaf() == x->leaf());

        // Determine which is the smaller/larger node.
        btree_node *smaller = this, *larger = x;
        if (smaller->count() > larger->count()) {
            swap(smaller, larger);
        }

        // Swap the values.
        for (slot_type *a = smaller->slot(0), *b = larger->slot(0),
                 *end = a + smaller->count();
             a != end; ++a, ++b) {
            params_type::swap(alloc, a, b);
        }

        // Move values that can't be swapped.
        const size_type to_move = larger->count() - smaller->count();
        larger->uninitialized_move_n(to_move, smaller->count(), smaller->count(),
                                     smaller, alloc);
        larger->value_destroy_n(smaller->count(), to_move, alloc);

        if (!leaf()) {
            // Swap the child pointers.
            std::swap_ranges(&smaller->mutable_child(0),
                             &smaller->mutable_child(smaller->count() + 1),
                             &larger->mutable_child(0));
            // Update swapped children's parent pointers.
            int i = 0;
            for (; i <= smaller->count(); ++i) {
                smaller->child(i)->set_parent(smaller);
                larger->child(i)->set_parent(larger);
            }
            // Move the child pointers that couldn't be swapped.
            for (; i <= larger->count(); ++i) {
                smaller->init_child(i, larger->child(i));
                larger->clear_child(i);
            }
        }

        // Swap the counts.
        swap(mutable_count(), x->mutable_count());
    }